

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O0

int init_socket_suff(s_SocketStuff *s,char *text_addr,int ip_version)

{
  int iVar1;
  int *piVar2;
  undefined4 local_140;
  undefined4 local_13c;
  int onOff;
  int reuseaddr_on;
  void *addr;
  undefined1 local_128 [2];
  sa_family_t domain;
  int sockError;
  char errorBuffer [256];
  int ip_version_local;
  char *text_addr_local;
  s_SocketStuff *s_local;
  
  local_13c = 1;
  (s->field_3).serverAddr = (sockaddr *)0x0;
  s->fd = 0;
  s->try_port = 0;
  s->actual_port = 0;
  (s->ss).__ss_padding[0x6e] = '\0';
  (s->ss).__ss_padding[0x6f] = '\0';
  (s->ss).__ss_padding[0x70] = '\0';
  (s->ss).__ss_padding[0x71] = '\0';
  (s->ss).__ss_padding[0x72] = '\0';
  (s->ss).__ss_padding[0x73] = '\0';
  (s->ss).__ss_padding[0x74] = '\0';
  (s->ss).__ss_padding[0x75] = '\0';
  (s->ss).__ss_align = 0;
  (s->ss).__ss_padding[0x5e] = '\0';
  (s->ss).__ss_padding[0x5f] = '\0';
  (s->ss).__ss_padding[0x60] = '\0';
  (s->ss).__ss_padding[0x61] = '\0';
  (s->ss).__ss_padding[0x62] = '\0';
  (s->ss).__ss_padding[99] = '\0';
  (s->ss).__ss_padding[100] = '\0';
  (s->ss).__ss_padding[0x65] = '\0';
  (s->ss).__ss_padding[0x66] = '\0';
  (s->ss).__ss_padding[0x67] = '\0';
  (s->ss).__ss_padding[0x68] = '\0';
  (s->ss).__ss_padding[0x69] = '\0';
  (s->ss).__ss_padding[0x6a] = '\0';
  (s->ss).__ss_padding[0x6b] = '\0';
  (s->ss).__ss_padding[0x6c] = '\0';
  (s->ss).__ss_padding[0x6d] = '\0';
  (s->ss).__ss_padding[0x4e] = '\0';
  (s->ss).__ss_padding[0x4f] = '\0';
  (s->ss).__ss_padding[0x50] = '\0';
  (s->ss).__ss_padding[0x51] = '\0';
  (s->ss).__ss_padding[0x52] = '\0';
  (s->ss).__ss_padding[0x53] = '\0';
  (s->ss).__ss_padding[0x54] = '\0';
  (s->ss).__ss_padding[0x55] = '\0';
  (s->ss).__ss_padding[0x56] = '\0';
  (s->ss).__ss_padding[0x57] = '\0';
  (s->ss).__ss_padding[0x58] = '\0';
  (s->ss).__ss_padding[0x59] = '\0';
  (s->ss).__ss_padding[0x5a] = '\0';
  (s->ss).__ss_padding[0x5b] = '\0';
  (s->ss).__ss_padding[0x5c] = '\0';
  (s->ss).__ss_padding[0x5d] = '\0';
  (s->ss).__ss_padding[0x3e] = '\0';
  (s->ss).__ss_padding[0x3f] = '\0';
  (s->ss).__ss_padding[0x40] = '\0';
  (s->ss).__ss_padding[0x41] = '\0';
  (s->ss).__ss_padding[0x42] = '\0';
  (s->ss).__ss_padding[0x43] = '\0';
  (s->ss).__ss_padding[0x44] = '\0';
  (s->ss).__ss_padding[0x45] = '\0';
  (s->ss).__ss_padding[0x46] = '\0';
  (s->ss).__ss_padding[0x47] = '\0';
  (s->ss).__ss_padding[0x48] = '\0';
  (s->ss).__ss_padding[0x49] = '\0';
  (s->ss).__ss_padding[0x4a] = '\0';
  (s->ss).__ss_padding[0x4b] = '\0';
  (s->ss).__ss_padding[0x4c] = '\0';
  (s->ss).__ss_padding[0x4d] = '\0';
  (s->ss).__ss_padding[0x2e] = '\0';
  (s->ss).__ss_padding[0x2f] = '\0';
  (s->ss).__ss_padding[0x30] = '\0';
  (s->ss).__ss_padding[0x31] = '\0';
  (s->ss).__ss_padding[0x32] = '\0';
  (s->ss).__ss_padding[0x33] = '\0';
  (s->ss).__ss_padding[0x34] = '\0';
  (s->ss).__ss_padding[0x35] = '\0';
  (s->ss).__ss_padding[0x36] = '\0';
  (s->ss).__ss_padding[0x37] = '\0';
  (s->ss).__ss_padding[0x38] = '\0';
  (s->ss).__ss_padding[0x39] = '\0';
  (s->ss).__ss_padding[0x3a] = '\0';
  (s->ss).__ss_padding[0x3b] = '\0';
  (s->ss).__ss_padding[0x3c] = '\0';
  (s->ss).__ss_padding[0x3d] = '\0';
  (s->ss).__ss_padding[0x1e] = '\0';
  (s->ss).__ss_padding[0x1f] = '\0';
  (s->ss).__ss_padding[0x20] = '\0';
  (s->ss).__ss_padding[0x21] = '\0';
  (s->ss).__ss_padding[0x22] = '\0';
  (s->ss).__ss_padding[0x23] = '\0';
  (s->ss).__ss_padding[0x24] = '\0';
  (s->ss).__ss_padding[0x25] = '\0';
  (s->ss).__ss_padding[0x26] = '\0';
  (s->ss).__ss_padding[0x27] = '\0';
  (s->ss).__ss_padding[0x28] = '\0';
  (s->ss).__ss_padding[0x29] = '\0';
  (s->ss).__ss_padding[0x2a] = '\0';
  (s->ss).__ss_padding[0x2b] = '\0';
  (s->ss).__ss_padding[0x2c] = '\0';
  (s->ss).__ss_padding[0x2d] = '\0';
  (s->ss).__ss_padding[0xe] = '\0';
  (s->ss).__ss_padding[0xf] = '\0';
  (s->ss).__ss_padding[0x10] = '\0';
  (s->ss).__ss_padding[0x11] = '\0';
  (s->ss).__ss_padding[0x12] = '\0';
  (s->ss).__ss_padding[0x13] = '\0';
  (s->ss).__ss_padding[0x14] = '\0';
  (s->ss).__ss_padding[0x15] = '\0';
  (s->ss).__ss_padding[0x16] = '\0';
  (s->ss).__ss_padding[0x17] = '\0';
  (s->ss).__ss_padding[0x18] = '\0';
  (s->ss).__ss_padding[0x19] = '\0';
  (s->ss).__ss_padding[0x1a] = '\0';
  (s->ss).__ss_padding[0x1b] = '\0';
  (s->ss).__ss_padding[0x1c] = '\0';
  (s->ss).__ss_padding[0x1d] = '\0';
  (s->ss).ss_family = 0;
  (s->ss).__ss_padding[0] = '\0';
  (s->ss).__ss_padding[1] = '\0';
  (s->ss).__ss_padding[2] = '\0';
  (s->ss).__ss_padding[3] = '\0';
  (s->ss).__ss_padding[4] = '\0';
  (s->ss).__ss_padding[5] = '\0';
  (s->ss).__ss_padding[6] = '\0';
  (s->ss).__ss_padding[7] = '\0';
  (s->ss).__ss_padding[8] = '\0';
  (s->ss).__ss_padding[9] = '\0';
  (s->ss).__ss_padding[10] = '\0';
  (s->ss).__ss_padding[0xb] = '\0';
  (s->ss).__ss_padding[0xc] = '\0';
  (s->ss).__ss_padding[0xd] = '\0';
  *(undefined8 *)s = 0;
  s->text_addr = (char *)0x0;
  *(undefined8 *)&s->address_len = 0;
  s->fd = -1;
  s->ip_version = ip_version;
  s->text_addr = text_addr;
  (s->field_3).serverAddr = (sockaddr *)&s->ss;
  errorBuffer._252_4_ = ip_version;
  if (ip_version == 4) {
    addr._2_2_ = 2;
    ((s->field_3).serverAddr)->sa_family = 2;
    s->address_len = 0x10;
    _onOff = ((s->field_3).serverAddr)->sa_data + 2;
  }
  else {
    if (ip_version != 6) {
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x30b,
                 "init_socket_suff(): Invalid IP version: %d.\n",(ulong)(uint)ip_version);
      goto LAB_0011b71e;
    }
    addr._2_2_ = 10;
    ((s->field_3).serverAddr)->sa_family = 10;
    s->address_len = 0x1c;
    _onOff = ((s->field_3).serverAddr)->sa_data + 6;
  }
  iVar1 = inet_pton((uint)addr._2_2_,text_addr,_onOff);
  if (0 < iVar1) {
    iVar1 = socket((uint)addr._2_2_,1,0);
    s->fd = iVar1;
    if (s->fd == -1) {
      piVar2 = __errno_location();
      __xpg_strerror_r(*piVar2,local_128,0x100);
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x31b,
                 "init_socket_suff(): IPv%c socket not available: %s\n",
                 (ulong)(uint)errorBuffer._252_4_,local_128);
    }
    else {
      if (errorBuffer._252_4_ == 6) {
        local_140 = 1;
        addr._4_4_ = setsockopt(s->fd,0x29,0x1a,&local_140,4);
        if (addr._4_4_ == -1) {
          piVar2 = __errno_location();
          __xpg_strerror_r(*piVar2,local_128,0x100);
          UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x32e,
                     "init_socket_suff(): unable to set IPv6 socket protocol: %s\n",local_128);
          goto LAB_0011b71e;
        }
      }
      addr._4_4_ = setsockopt(s->fd,1,2,&local_13c,4);
      if (addr._4_4_ != -1) {
        return 0;
      }
      piVar2 = __errno_location();
      __xpg_strerror_r(*piVar2,local_128,0x100);
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x345,
                 "init_socket_suff(): unable to set SO_REUSEADDR: %s\n",local_128);
    }
  }
LAB_0011b71e:
  if (s->fd != -1) {
    sock_close(s->fd);
  }
  s->fd = -1;
  return 1;
}

Assistant:

static int init_socket_suff(
	struct s_SocketStuff *s, const char *text_addr, int ip_version)
{
	char errorBuffer[ERROR_BUFFER_LEN];
	int sockError;
	sa_family_t domain;
	void *addr;
	int reuseaddr_on = MINISERVER_REUSEADDR;

	memset(s, 0, sizeof *s);
	s->fd = INVALID_SOCKET;
	s->ip_version = ip_version;
	s->text_addr = text_addr;
	s->serverAddr = (struct sockaddr *)&s->ss;
	switch (ip_version) {
	case 4:
		domain = AF_INET;
		s->serverAddr4->sin_family = domain;
		s->address_len = sizeof *s->serverAddr4;
		addr = &s->serverAddr4->sin_addr;
		break;
	case 6:
		if (!ENABLE_IPV6) {
			goto ok;
		}
		domain = AF_INET6;
		s->serverAddr6->sin6_family = domain;
		s->address_len = sizeof *s->serverAddr6;
		addr = &s->serverAddr6->sin6_addr;
		break;
	default:
		UpnpPrintf(UPNP_INFO,
			MSERV,
			__FILE__,
			__LINE__,
			"init_socket_suff(): Invalid IP version: %d.\n",
			ip_version);
		goto error;
		break;
	}

	if (inet_pton(domain, text_addr, addr) <= 0)
		goto error;

	s->fd = socket(domain, SOCK_STREAM, 0);
	if (s->fd == INVALID_SOCKET) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_INFO,
			MSERV,
			__FILE__,
			__LINE__,
			"init_socket_suff(): IPv%c socket not available: "
			"%s\n",
			ip_version,
			errorBuffer);
		goto error;
	} else if (ip_version == 6) {
		int onOff = 1;

		sockError = setsockopt(s->fd,
			IPPROTO_IPV6,
			IPV6_V6ONLY,
			(char *)&onOff,
			sizeof(onOff));
		if (sockError == SOCKET_ERROR) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"init_socket_suff(): unable to set IPv6 "
				"socket protocol: %s\n",
				errorBuffer);
			goto error;
		}
	}
	/* Getting away with implementation of re-using address:port and
	 * instead choosing to increment port numbers.
	 * Keeping the re-use address code as an optional behaviour that
	 * can be turned on if necessary.
	 * TURN ON the reuseaddr_on option to use the option. */
	if (MINISERVER_REUSEADDR) {
		sockError = setsockopt(s->fd,
			SOL_SOCKET,
			SO_REUSEADDR,
			(const char *)&reuseaddr_on,
			sizeof(int));
		if (sockError == SOCKET_ERROR) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"init_socket_suff(): unable to set "
				"SO_REUSEADDR: %s\n",
				errorBuffer);
			goto error;
		}
	}
ok:
	return 0;

error:
	if (s->fd != INVALID_SOCKET) {
		sock_close(s->fd);
	}
	s->fd = INVALID_SOCKET;

	return 1;
}